

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O0

void __thiscall Imf_3_4::OutputFile::writePixels(OutputFile *this,int numScanLines)

{
  long lVar1;
  value_type pLVar2;
  bool bVar3;
  size_type sVar4;
  ArgExc *pAVar5;
  int *piVar6;
  Task *pTVar7;
  Data *this_00;
  size_type sVar8;
  reference ppLVar9;
  IoExc *this_01;
  int iVar10;
  int in_ESI;
  void *__stat_loc;
  long in_RDI;
  stringstream _iex_replace_s;
  BaseExc *e;
  LineBuffer *lineBuffer;
  size_t i_2;
  string *exception;
  int numLines;
  LineBuffer *writeBuffer;
  int i_1;
  int numTasks_1;
  int last_1;
  int i;
  int numTasks;
  int last;
  TaskGroup taskGroup;
  int scanLineMax;
  int scanLineMin;
  int step;
  int stop;
  int nextCompressBuffer;
  int nextWriteBuffer;
  int first;
  lock_guard<std::mutex> lock;
  Data *in_stack_fffffffffffffd48;
  OutputStreamMutex *in_stack_fffffffffffffd50;
  int in_stack_fffffffffffffd5c;
  Data *in_stack_fffffffffffffd60;
  undefined8 in_stack_fffffffffffffd70;
  undefined8 in_stack_fffffffffffffd78;
  Data *in_stack_fffffffffffffd80;
  Data *ofd;
  TaskGroup *in_stack_fffffffffffffd88;
  LineBufferTask_conflict *in_stack_fffffffffffffd90;
  size_type local_98;
  string *local_90;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  TaskGroup local_48 [8];
  int local_40;
  int local_3c;
  int local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  int local_c;
  
  local_c = in_ESI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffd50,
             (mutex_type *)in_stack_fffffffffffffd48);
  sVar4 = std::
          vector<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
          ::size((vector<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
                  *)(*(long *)(in_RDI + 8) + 0xe8));
  if (sVar4 == 0) {
    pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar5,"No frame buffer specified as pixel data source.");
    __cxa_throw(pAVar5,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  lVar1 = *(long *)(in_RDI + 8);
  local_2c = (*(int *)(lVar1 + 0x78) - *(int *)(lVar1 + 0x8c)) / *(int *)(lVar1 + 0x120);
  local_28 = local_2c;
  IlmThread_3_4::TaskGroup::TaskGroup(local_48);
  if (*(int *)(*(long *)(in_RDI + 8) + 0x80) == 0) {
    lVar1 = *(long *)(in_RDI + 8);
    local_4c = (int)(~*(uint *)(lVar1 + 0x8c) + local_c + *(int *)(lVar1 + 0x78)) /
               *(int *)(lVar1 + 0x120);
    local_3c = *(int *)(*(long *)(in_RDI + 8) + 0x78);
    local_40 = *(int *)(*(long *)(in_RDI + 8) + 0x78) + -1 + local_c;
    sVar4 = std::
            vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
            ::size((vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                    *)(*(long *)(in_RDI + 8) + 0x108));
    local_54 = (int)sVar4;
    local_58 = (local_4c - local_28) + 1;
    piVar6 = std::min<int>(&local_54,&local_58);
    local_5c = 1;
    piVar6 = std::max<int>(piVar6,&local_5c);
    local_50 = *piVar6;
    for (local_60 = 0; local_60 < local_50; local_60 = local_60 + 1) {
      pTVar7 = (Task *)operator_new(0x20);
      anon_unknown_6::LineBufferTask::LineBufferTask
                (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                 (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),(int)in_stack_fffffffffffffd78,
                 (int)((ulong)in_stack_fffffffffffffd70 >> 0x20));
      IlmThread_3_4::ThreadPool::addGlobalTask(pTVar7);
    }
    local_30 = local_28 + local_50;
    local_34 = local_4c + 1;
    local_38 = 1;
  }
  else {
    lVar1 = *(long *)(in_RDI + 8);
    local_64 = (((*(int *)(lVar1 + 0x78) - local_c) - *(int *)(lVar1 + 0x8c)) + 1) /
               *(int *)(lVar1 + 0x120);
    local_40 = *(int *)(*(long *)(in_RDI + 8) + 0x78);
    local_3c = (*(int *)(*(long *)(in_RDI + 8) + 0x78) - local_c) + 1;
    sVar4 = std::
            vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
            ::size((vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                    *)(*(long *)(in_RDI + 8) + 0x108));
    local_6c = (int)sVar4;
    local_70 = (local_28 - local_64) + 1;
    piVar6 = std::min<int>(&local_6c,&local_70);
    local_74 = 1;
    piVar6 = std::max<int>(piVar6,&local_74);
    local_68 = *piVar6;
    for (local_78 = 0; local_78 < local_68; local_78 = local_78 + 1) {
      in_stack_fffffffffffffd90 = (LineBufferTask_conflict *)operator_new(0x20);
      anon_unknown_6::LineBufferTask::LineBufferTask
                (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                 (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),(int)in_stack_fffffffffffffd78,
                 (int)((ulong)in_stack_fffffffffffffd70 >> 0x20));
      IlmThread_3_4::ThreadPool::addGlobalTask(&in_stack_fffffffffffffd90->super_Task);
    }
    local_30 = local_28 - local_68;
    local_34 = local_64 - 1;
    local_38 = -1;
  }
  while( true ) {
    if (*(int *)(*(long *)(in_RDI + 8) + 0x7c) < 1) {
      pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc
                (pAVar5,"Tried to write more scan lines than specified by the data window.");
      __cxa_throw(pAVar5,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    __stat_loc = (void *)(ulong)local_2c;
    this_00 = (Data *)Data::getLineBuffer(in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
    ofd = this_00;
    anon_unknown_6::LineBuffer::wait((LineBuffer *)this_00,__stat_loc);
    iVar10 = (*(int *)&(this_00->header).field_0x34 - *(int *)&(this_00->header)._readsNothing) + 1;
    *(int *)(*(long *)(in_RDI + 8) + 0x7c) = *(int *)(*(long *)(in_RDI + 8) + 0x7c) - iVar10;
    if (((ulong)this_00->previewPosition & 1) != 0) break;
    anon_unknown_6::writePixelData
              (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,(LineBuffer *)0x217dc3);
    local_2c = local_2c + local_38;
    *(int *)(*(long *)(in_RDI + 8) + 0x78) =
         *(int *)(*(long *)(in_RDI + 8) + 0x78) + local_38 * iVar10;
    anon_unknown_6::LineBuffer::post((LineBuffer *)0x217e0e);
    if (local_2c == local_34) {
      bVar3 = false;
      goto LAB_00217edb;
    }
    if (local_30 != local_34) {
      pTVar7 = (Task *)operator_new(0x20);
      anon_unknown_6::LineBufferTask::LineBufferTask
                (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,ofd,
                 (int)((ulong)pTVar7 >> 0x20),(int)pTVar7,
                 (int)((ulong)in_stack_fffffffffffffd70 >> 0x20));
      IlmThread_3_4::ThreadPool::addGlobalTask(pTVar7);
      local_30 = local_38 + local_30;
    }
  }
  *(int *)(*(long *)(in_RDI + 8) + 0x78) =
       *(int *)(*(long *)(in_RDI + 8) + 0x78) + local_38 * iVar10;
  anon_unknown_6::LineBuffer::post((LineBuffer *)0x217d91);
  bVar3 = true;
LAB_00217edb:
  IlmThread_3_4::TaskGroup::~TaskGroup(local_48);
  if (!bVar3) {
    local_90 = (string *)0x0;
    local_98 = 0;
    while (sVar4 = local_98,
          sVar8 = std::
                  vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                  ::size((vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                          *)(*(long *)(in_RDI + 8) + 0x108)), sVar4 < sVar8) {
      ppLVar9 = std::
                vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                ::operator[]((vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                              *)(*(long *)(in_RDI + 8) + 0x108),local_98);
      pLVar2 = *ppLVar9;
      if ((((ulong)(pLVar2->sampleCountTableBuffer)._data & 0x100) != 0) &&
         (local_90 == (string *)0x0)) {
        local_90 = (string *)&pLVar2->sampleCountTablePtr;
      }
      *(undefined1 *)((long)&(pLVar2->sampleCountTableBuffer)._data + 1) = 0;
      local_98 = local_98 + 1;
    }
    if (local_90 != (string *)0x0) {
      this_01 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::IoExc::IoExc(this_01,local_90);
      __cxa_throw(this_01,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
    }
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x21805c);
  return;
}

Assistant:

void
OutputFile::writePixels (int numScanLines)
{
    try
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
        if (_data->slices.size () == 0)
            throw IEX_NAMESPACE::ArgExc (
                "No frame buffer specified as pixel data source.");

        //
        // Maintain two iterators:
        //     nextWriteBuffer: next linebuffer to be written to the file
        //     nextCompressBuffer: next linebuffer to compress
        //

        int first =
            (_data->currentScanLine - _data->minY) / _data->linesInBuffer;

        int nextWriteBuffer = first;
        int nextCompressBuffer;
        int stop;
        int step;
        int scanLineMin;
        int scanLineMax;

        {
            //
            // Create a task group for all line buffer tasks. When the
            // taskgroup goes out of scope, the destructor waits until
            // all tasks are complete.
            //

            TaskGroup taskGroup;

            //
            // Determine the range of lineBuffers that intersect the scan
            // line range.  Then add the initial compression tasks to the
            // thread pool.  We always add in at least one task but the
            // individual task might not do anything if numScanLines == 0.
            //

            if (_data->lineOrder == INCREASING_Y)
            {
                int last = (_data->currentScanLine + (numScanLines - 1) -
                            _data->minY) /
                           _data->linesInBuffer;

                scanLineMin = _data->currentScanLine;
                scanLineMax = _data->currentScanLine + numScanLines - 1;

                int numTasks = max (
                    min ((int) _data->lineBuffers.size (), last - first + 1),
                    1);

                for (int i = 0; i < numTasks; i++)
                {
                    ThreadPool::addGlobalTask (new LineBufferTask (
                        &taskGroup,
                        _data,
                        first + i,
                        scanLineMin,
                        scanLineMax));
                }

                nextCompressBuffer = first + numTasks;
                stop               = last + 1;
                step               = 1;
            }
            else
            {
                int last = (_data->currentScanLine - (numScanLines - 1) -
                            _data->minY) /
                           _data->linesInBuffer;

                scanLineMax = _data->currentScanLine;
                scanLineMin = _data->currentScanLine - numScanLines + 1;

                int numTasks = max (
                    min ((int) _data->lineBuffers.size (), first - last + 1),
                    1);

                for (int i = 0; i < numTasks; i++)
                {
                    ThreadPool::addGlobalTask (new LineBufferTask (
                        &taskGroup,
                        _data,
                        first - i,
                        scanLineMin,
                        scanLineMax));
                }

                nextCompressBuffer = first - numTasks;
                stop               = last - 1;
                step               = -1;
            }

            while (true)
            {
                if (_data->missingScanLines <= 0)
                {
                    throw IEX_NAMESPACE::ArgExc (
                        "Tried to write more scan lines "
                        "than specified by the data window.");
                }

                //
                // Wait until the next line buffer is ready to be written
                //

                LineBuffer* writeBuffer =
                    _data->getLineBuffer (nextWriteBuffer);

                writeBuffer->wait ();

                int numLines =
                    writeBuffer->scanLineMax - writeBuffer->scanLineMin + 1;

                _data->missingScanLines -= numLines;

                //
                // If the line buffer is only partially full, then it is
                // not complete and we cannot write it to disk yet.
                //

                if (writeBuffer->partiallyFull)
                {
                    _data->currentScanLine =
                        _data->currentScanLine + step * numLines;
                    writeBuffer->post ();

                    return;
                }

                //
                // Write the line buffer
                //

                writePixelData (_data->_streamData, _data, writeBuffer);
                nextWriteBuffer += step;

                _data->currentScanLine =
                    _data->currentScanLine + step * numLines;

#ifdef DEBUG

                assert (
                    _data->currentScanLine ==
                    ((_data->lineOrder == INCREASING_Y)
                         ? writeBuffer->scanLineMax + 1
                         : writeBuffer->scanLineMin - 1));

#endif

                //
                // Release the lock on the line buffer
                //

                writeBuffer->post ();

                //
                // If this was the last line buffer in the scanline range
                //

                if (nextWriteBuffer == stop) break;

                //
                // If there are no more line buffers to compress,
                // then only continue to write out remaining lineBuffers
                //

                if (nextCompressBuffer == stop) continue;

                //
                // Add nextCompressBuffer as a compression task
                //

                ThreadPool::addGlobalTask (new LineBufferTask (
                    &taskGroup,
                    _data,
                    nextCompressBuffer,
                    scanLineMin,
                    scanLineMax));

                //
                // Update the next line buffer we need to compress
                //

                nextCompressBuffer += step;
            }

            //
            // Finish all tasks
            //
        }

        //
        // Exception handling:
        //
        // LineBufferTask::execute() may have encountered exceptions, but
        // those exceptions occurred in another thread, not in the thread
        // that is executing this call to OutputFile::writePixels().
        // LineBufferTask::execute() has caught all exceptions and stored
        // the exceptions' what() strings in the line buffers.
        // Now we check if any line buffer contains a stored exception; if
        // this is the case then we re-throw the exception in this thread.
        // (It is possible that multiple line buffers contain stored
        // exceptions.  We re-throw the first exception we find and
        // ignore all others.)
        //

        const string* exception = 0;

        for (size_t i = 0; i < _data->lineBuffers.size (); ++i)
        {
            LineBuffer* lineBuffer = _data->lineBuffers[i];

            if (lineBuffer->hasException && !exception)
                exception = &lineBuffer->exception;

            lineBuffer->hasException = false;
        }

        if (exception) throw IEX_NAMESPACE::IoExc (*exception);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        REPLACE_EXC (
            e,
            "Failed to write pixel data to image "
            "file \""
                << fileName () << "\". " << e.what ());
        throw;
    }
}